

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O1

void poly_short_sample_plus(poly *out,uint8_t *in)

{
  short sVar1;
  long lVar2;
  ulong uVar3;
  
  poly_short_sample(out,in);
  lVar2 = 1;
  sVar1 = 0;
  do {
    sVar1 = sVar1 + (out->field_0).v[lVar2] * *(short *)((long)out + lVar2 * 2 + -2);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 700);
  uVar3 = 0xfffffffffffffffe;
  do {
    *(ushort *)((long)&out->field_0 + uVar3 * 2 + 4) =
         *(short *)((long)&out->field_0 + uVar3 * 2 + 4) * (sVar1 >> 0xf | 1U);
    uVar3 = uVar3 + 2;
  } while (uVar3 < 699);
  poly_assert_normalized(out);
  return;
}

Assistant:

static void poly_short_sample_plus(struct poly *out,
                                   const uint8_t in[HRSS_SAMPLE_BYTES]) {
  poly_short_sample(out, in);

  // sum (and the product in the for loop) will overflow. But that's fine
  // because |sum| is bound by +/- (N-2), and N < 2^15 so it works out.
  uint16_t sum = 0;
  for (unsigned i = 0; i < N - 2; i++) {
    sum += (unsigned)out->v[i] * out->v[i + 1];
  }

  // If the sum is negative, flip the sign of even-positioned coefficients. (See
  // page 8 of [HRSS].)
  sum = ((int16_t)sum) >> 15;
  const uint16_t scale = sum | (~sum & 1);
  for (unsigned i = 0; i < N; i += 2) {
    out->v[i] = (unsigned)out->v[i] * scale;
  }
  poly_assert_normalized(out);
}